

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O2

void Fax3BadLength(char *module,TIFF *tif,uint32_t line,uint32_t a0,uint32_t lastx)

{
  uint32_t *puVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar3 = "tile";
  puVar1 = &tif->tif_curtile;
  if ((tif->tif_flags >> 10 & 1) == 0) {
    pcVar3 = "strip";
    puVar1 = &tif->tif_curstrip;
  }
  pcVar2 = "Line length mismatch";
  if (a0 < lastx) {
    pcVar2 = "Premature EOL";
  }
  TIFFWarningExtR(tif,module,"%s at line %u of %s %u (got %u, expected %u)",pcVar2,(ulong)line,
                  pcVar3,(ulong)*puVar1,(ulong)a0,(ulong)lastx);
  return;
}

Assistant:

static void Fax3BadLength(const char *module, TIFF *tif, uint32_t line,
                          uint32_t a0, uint32_t lastx)
{
    TIFFWarningExtR(tif, module,
                    "%s at line %" PRIu32 " of %s %" PRIu32 " (got %" PRIu32
                    ", expected %" PRIu32 ")",
                    a0 < lastx ? "Premature EOL" : "Line length mismatch", line,
                    isTiled(tif) ? "tile" : "strip",
                    (isTiled(tif) ? tif->tif_curtile : tif->tif_curstrip), a0,
                    lastx);
}